

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O0

JITTypeHolder __thiscall ObjTypeSpecFldInfo::GetType(ObjTypeSpecFldInfo *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FixedFieldInfo *pFVar4;
  JITType *pJVar5;
  JITType *type;
  uint i_local;
  ObjTypeSpecFldInfo *this_local;
  
  if (i != 0) {
    bVar2 = IsPoly(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x11f,"(i == 0 || IsPoly())","i == 0 || IsPoly()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  if ((this->m_data).fixedFieldInfoArraySize <= i) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x120,"(i < m_data.fixedFieldInfoArraySize)",
                       "i < m_data.fixedFieldInfoArraySize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pFVar4 = GetFixedFieldInfoArray(this);
  pJVar5 = FixedFieldInfo::GetType(pFVar4 + i);
  if (pJVar5 == (JITType *)0x0) {
    JITTypeHolderBase<void>::JITTypeHolderBase
              ((JITTypeHolderBase<void> *)&this_local,(JITType *)0x0);
  }
  else {
    pFVar4 = GetFixedFieldInfoArray(this);
    pJVar5 = FixedFieldInfo::GetType(pFVar4 + i);
    JITTypeHolderBase<void>::JITTypeHolderBase((JITTypeHolderBase<void> *)&this_local,pJVar5);
  }
  return (JITTypeHolder)(Type)this_local;
}

Assistant:

JITTypeHolder
ObjTypeSpecFldInfo::GetType(uint i) const
{
    Assert(i == 0 || IsPoly());
    AssertOrFailFast(i < m_data.fixedFieldInfoArraySize);
    JITType * type = GetFixedFieldInfoArray()[i].GetType();
    if (!type)
    {
        return nullptr;
    }
    return JITTypeHolder(GetFixedFieldInfoArray()[i].GetType());
}